

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExpressionPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionPatternSyntax,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args)

{
  ExpressionPatternSyntax *this_00;
  ExpressionSyntax *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ExpressionPatternSyntax *)allocate(this,0x18,8);
  slang::syntax::ExpressionPatternSyntax::ExpressionPatternSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }